

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool tinygltf::detail::
     ForEachInArray<tinygltf::TinyGLTF::LoadFromString(tinygltf::Model*,std::__cxx11::string*,std::__cxx11::string*,char_const*,unsigned_int,std::__cxx11::string_const&,unsigned_int)::__4>
               (json *_v,char *member,anon_class_24_3_07ed8cb9 *cb)

{
  char cVar1;
  bool bVar2;
  reference pbVar3;
  string *err;
  ostream *poVar4;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *o;
  pointer pcVar5;
  bool bVar6;
  int target;
  size_t byteStride;
  int buffer;
  size_t byteLength;
  size_t byteOffset;
  stringstream ss;
  json_const_iterator itm;
  json_const_array_iterator end;
  json_const_array_iterator it;
  string local_3d0;
  uint local_3ac;
  string *local_3a8;
  size_t local_3a0;
  int local_394;
  char *local_390;
  size_t local_388;
  size_t local_380;
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368 [7];
  ios_base local_2f8 [264];
  undefined1 local_1f0 [272];
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  bool local_a0;
  json_const_iterator local_98;
  const_iterator local_70;
  const_iterator local_50;
  
  local_98.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_98.m_object = (pointer)0x0;
  local_98.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_98.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_390 = member;
  bVar2 = FindMember(_v,"bufferViews",&local_98);
  if ((bVar2) &&
     (pbVar3 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_98), pbVar3->m_type == array)) {
    pbVar3 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin(&local_50,pbVar3);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend(&local_70,pbVar3);
    bVar2 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_50,&local_70);
    if (!bVar2) {
      do {
        pcVar5 = local_378 + 0x10;
        err = (string *)
              nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&local_50);
        if (*(char *)&(err->_M_dataplus)._M_p != '\x01') {
          if ((char *)**(undefined8 **)local_390 == (char *)0x0) {
            return false;
          }
          std::__cxx11::string::append((char *)**(undefined8 **)local_390);
          return false;
        }
        local_1f0._0_8_ = local_1f0 + 0x10;
        local_1f0._8_8_ = 0;
        local_1f0[0x10] = '\0';
        local_1f0._32_4_ = -1;
        local_1f0._72_4_ = 0;
        local_1f0._76_4_ = 0;
        local_1f0._80_8_ = 0.0;
        local_1f0._56_4_ = 0;
        local_1f0._60_4_ = 0;
        local_1f0._64_4_ = 0;
        local_1f0._40_8_ = 0;
        local_1f0._48_4_ = 0;
        local_1f0._52_4_ = 0;
        local_1f0._88_8_ = local_1f0 + 0x68;
        local_1f0._96_8_ = 0;
        local_1f0[0x68] = '\0';
        local_1f0._176_4_ = _S_red;
        local_1f0._184_8_ = (_Base_ptr)0x0;
        local_1f0._152_8_ = (pointer)0x0;
        local_1f0._160_8_ = (pointer)0x0;
        local_1f0._136_8_ = (pointer)0x0;
        local_1f0._144_8_ = (pointer)0x0;
        local_1f0._120_8_ = (pointer)0x0;
        local_1f0._128_8_ = (pointer)0x0;
        local_1f0._192_8_ = local_1f0 + 0xb0;
        local_1f0._208_8_ = 0;
        local_1f0[0xd8] = false;
        local_1f0._232_4_ = _S_red;
        local_1f0._240_8_ = (_Base_ptr)0x0;
        local_1f0._248_8_ = local_1f0 + 0xe8;
        local_1f0._264_8_ = 0;
        local_e0._M_p = (pointer)&local_d0;
        local_d8 = 0;
        local_d0._M_local_buf[0] = '\0';
        local_c0._M_p = (pointer)&local_b0;
        local_b8 = 0;
        local_b0._M_local_buf[0] = '\0';
        local_a0 = false;
        local_3a8 = (string *)**(undefined8 **)local_390;
        cVar1 = *(char *)(*(long *)(local_390 + 8) + 0x19);
        local_394 = -1;
        local_378._8_8_ = (_Base_ptr)0x6;
        local_368[0]._0_7_ = 0x726566667562;
        local_3d0.field_2._M_allocated_capacity = 0x6956726566667542;
        local_3d0.field_2._8_2_ = 0x7765;
        local_3d0._M_string_length = 10;
        local_3d0.field_2._M_local_buf[10] = '\0';
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        local_378._0_8_ = pcVar5;
        local_1f0._200_8_ = local_1f0._192_8_;
        local_1f0._256_8_ = local_1f0._248_8_;
        bVar2 = ParseIntegerProperty
                          (&local_394,local_3a8,(json *)err,(string *)local_378,true,&local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p);
        }
        if ((pointer)local_378._0_8_ != pcVar5) {
          operator_delete((void *)local_378._0_8_);
        }
        if (bVar2) {
          local_380 = 0;
          local_368[0]._M_allocated_capacity = 0x7366664f65747962;
          local_378._8_8_ = (_Base_ptr)0xa;
          local_368[0]._8_3_ = 0x7465;
          local_3d0._M_string_length = 0;
          local_3d0.field_2._M_allocated_capacity =
               local_3d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
          local_378._0_8_ = pcVar5;
          ParseUnsignedProperty
                    (&local_380,local_3a8,(json *)err,(string *)local_378,false,&local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
            operator_delete(local_3d0._M_dataplus._M_p);
          }
          if ((pointer)local_378._0_8_ != pcVar5) {
            operator_delete((void *)local_378._0_8_);
          }
          local_388 = 1;
          local_368[0]._M_allocated_capacity = 0x676e654c65747962;
          local_378._8_8_ = (_Base_ptr)0xa;
          local_368[0]._8_3_ = 0x6874;
          local_3d0.field_2._M_allocated_capacity = 0x6956726566667542;
          local_3d0.field_2._8_2_ = 0x7765;
          local_3d0._M_string_length = 10;
          local_3d0.field_2._M_local_buf[10] = '\0';
          local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
          local_378._0_8_ = pcVar5;
          bVar2 = ParseUnsignedProperty
                            (&local_388,local_3a8,(json *)err,(string *)local_378,true,&local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
            operator_delete(local_3d0._M_dataplus._M_p);
          }
          if ((pointer)local_378._0_8_ != pcVar5) {
            operator_delete((void *)local_378._0_8_);
          }
          if (!bVar2) goto LAB_00112089;
          local_3a0 = 0;
          local_368[0]._M_allocated_capacity = 0x6972745365747962;
          local_378._8_8_ = (_Base_ptr)0xa;
          local_368[0]._8_3_ = 0x6564;
          local_3d0._M_string_length = 0;
          local_3d0.field_2._M_allocated_capacity =
               local_3d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
          local_378._0_8_ = pcVar5;
          bVar2 = ParseUnsignedProperty
                            (&local_3a0,local_3a8,(json *)err,(string *)local_378,false,&local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
            operator_delete(local_3d0._M_dataplus._M_p);
          }
          if ((pointer)local_378._0_8_ != pcVar5) {
            operator_delete((void *)local_378._0_8_);
          }
          if (!bVar2) {
            local_3a0 = 0;
          }
          bVar6 = (local_3a0 & 3) == 0;
          bVar2 = bVar6 && local_3a0 < 0xfd;
          if (bVar6 && local_3a0 < 0xfd) {
            local_3ac = 0;
            local_378._0_8_ = local_378 + 0x10;
            local_378._8_8_ = (_Base_ptr)0x6;
            local_368[0]._0_7_ = 0x746567726174;
            local_3d0._M_string_length = 0;
            local_3d0.field_2._M_allocated_capacity =
                 local_3d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
            ParseIntegerProperty
                      ((int *)&local_3ac,local_3a8,(json *)err,(string *)local_378,false,&local_3d0)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
              operator_delete(local_3d0._M_dataplus._M_p);
            }
            if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
              operator_delete((void *)local_378._0_8_);
            }
            if ((local_3ac & 0xfffffffe) != 0x8892) {
              local_3ac = 0;
            }
            local_1f0._64_4_ = local_3ac;
            local_378._0_8_ = local_378 + 0x10;
            local_378._8_8_ = (_Base_ptr)0x4;
            local_368[0]._0_5_ = 0x656d616e;
            local_3d0._M_string_length = 0;
            local_3d0.field_2._M_allocated_capacity =
                 local_3d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
            ParseStringProperty((string *)local_1f0,local_3a8,(json *)err,(string *)local_378,false,
                                &local_3d0);
            o = extraout_RDX;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
              operator_delete(local_3d0._M_dataplus._M_p);
              o = extraout_RDX_00;
            }
            if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
              operator_delete((void *)local_378._0_8_);
              o = extraout_RDX_01;
            }
            ParseExtensionsProperty((ExtensionMap *)(local_1f0 + 0xe0),err,o);
            ParseExtrasProperty((Value *)(local_1f0 + 0x48),(json *)err);
            if (cVar1 != '\0') {
              local_368[0]._M_allocated_capacity = 0;
              local_378._0_8_ = (pointer)0x0;
              local_378._8_8_ = (_Base_ptr)0x0;
              local_368[0]._8_8_ = 0x8000000000000000;
              bVar6 = FindMember((json *)err,"extensions",(json_const_iterator *)local_378);
              if (bVar6) {
                pbVar3 = nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)local_378);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::dump(&local_3d0,pbVar3,-1,' ',false,strict);
                std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_3d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                  operator_delete(local_3d0._M_dataplus._M_p);
                }
              }
              local_368[0]._M_allocated_capacity = 0;
              local_378._0_8_ = (pointer)0x0;
              local_378._8_8_ = (_Base_ptr)0x0;
              local_368[0]._8_8_ = 0x8000000000000000;
              bVar6 = FindMember((json *)err,"extras",(json_const_iterator *)local_378);
              if (bVar6) {
                pbVar3 = nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)local_378);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::dump(&local_3d0,pbVar3,-1,' ',false,strict);
                std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_3d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                  operator_delete(local_3d0._M_dataplus._M_p);
                }
              }
            }
            local_1f0._32_4_ = local_394;
            local_1f0._40_8_ = local_380;
            local_1f0._48_4_ = (undefined4)local_388;
            local_1f0._52_4_ = (undefined4)(local_388 >> 0x20);
            local_1f0._56_4_ = (undefined4)local_3a0;
            local_1f0._60_4_ = (undefined4)(local_3a0 >> 0x20);
          }
          else if (local_3a8 != (string *)0x0) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_378);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_378 + 0x10),
                       "Invalid `byteStride\' value. `byteStride\' must be the multiple of 4 : ",
                       0x45);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)(local_378 + 0x10));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_append((char *)local_3a8,(ulong)local_3d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
              operator_delete(local_3d0._M_dataplus._M_p);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_378);
            std::ios_base::~ios_base(local_2f8);
          }
        }
        else {
LAB_00112089:
          bVar2 = false;
        }
        if (!bVar2) {
          BufferView::~BufferView((BufferView *)local_1f0);
          return false;
        }
        std::vector<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>::
        emplace_back<tinygltf::BufferView>
                  ((vector<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_> *)
                   (**(long **)(local_390 + 0x10) + 0x48),(BufferView *)local_1f0);
        BufferView::~BufferView((BufferView *)local_1f0);
        if (!bVar2) {
          return false;
        }
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&local_50);
        bVar2 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_50,&local_70);
      } while (!bVar2);
    }
  }
  return true;
}

Assistant:

bool ForEachInArray(const detail::json &_v, const char *member, Callback &&cb) {
  detail::json_const_iterator itm;
  if (detail::FindMember(_v, member, itm) &&
      detail::IsArray(detail::GetValue(itm))) {
    const detail::json &root = detail::GetValue(itm);
    auto it = detail::ArrayBegin(root);
    auto end = detail::ArrayEnd(root);
    for (; it != end; ++it) {
      if (!cb(*it)) return false;
    }
  }
  return true;
}